

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

LaneArray<8> * __thiscall
wasm::getLanes<short,8>(LaneArray<8> *__return_storage_ptr__,wasm *this,Literal *val)

{
  Literal *other;
  byte bVar1;
  byte *pbVar2;
  reference this_00;
  size_type __n;
  size_type __n_00;
  undefined1 local_60 [8];
  array<unsigned_char,_16UL> bytes;
  
  if (*(long *)(this + 0x10) == 6) {
    _local_60 = Literal::getv128((Literal *)this);
    __n_00 = 0;
    memset(__return_storage_ptr__,0,0xc0);
    for (__n = 0; __n != 8; __n = __n + 1) {
      pbVar2 = std::array<unsigned_char,_16UL>::at((array<unsigned_char,_16UL> *)local_60,__n_00);
      bVar1 = *pbVar2;
      pbVar2 = std::array<unsigned_char,_16UL>::at
                         ((array<unsigned_char,_16UL> *)local_60,__n_00 + 1);
      bytes._M_elems._8_4_ = (int)(short)((ushort)*pbVar2 << 8) | (uint)bVar1;
      this_00 = std::array<wasm::Literal,_8UL>::at(__return_storage_ptr__,__n);
      other = (Literal *)(bytes._M_elems + 8);
      if (this_00 != other) {
        Literal::~Literal(this_00);
        Literal::Literal(this_00,other);
      }
      Literal::~Literal(other);
      __n_00 = __n_00 + 2;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Type::v128",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x647,"LaneArray<Lanes> wasm::getLanes(const Literal &) [LaneT = short, Lanes = 8]"
               );
}

Assistant:

static LaneArray<Lanes> getLanes(const Literal& val) {
  assert(val.type == Type::v128);
  const size_t lane_width = 16 / Lanes;
  std::array<uint8_t, 16> bytes = val.getv128();
  LaneArray<Lanes> lanes;
  for (size_t lane_index = 0; lane_index < Lanes; ++lane_index) {
    LaneT lane(0);
    for (size_t offset = 0; offset < lane_width; ++offset) {
      lane |= LaneT(bytes.at(lane_index * lane_width + offset))
              << LaneT(8 * offset);
    }
    lanes.at(lane_index) = Literal(lane);
  }
  return lanes;
}